

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transupp.c
# Opt level: O1

void do_flip_h_no_crop(j_decompress_ptr srcinfo,j_compress_ptr dstinfo,JDIMENSION x_crop_offset,
                      jvirt_barray_ptr *src_coef_arrays)

{
  long lVar1;
  JCOEF JVar2;
  short sVar3;
  uint uVar4;
  int iVar5;
  jpeg_component_info *pjVar6;
  uint uVar7;
  JBLOCKARRAY ppaJVar8;
  int iVar9;
  long lVar10;
  JCOEF *pJVar11;
  long lVar12;
  JDIMENSION JVar13;
  JCOEF *pJVar14;
  JBLOCKROW paJVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  
  uVar4 = srcinfo->output_width;
  iVar5 = dstinfo->max_h_samp_factor;
  if (0 < dstinfo->num_components) {
    lVar12 = 0;
    do {
      pjVar6 = dstinfo->comp_info;
      if (pjVar6[lVar12].height_in_blocks != 0) {
        uVar17 = pjVar6[lVar12].h_samp_factor * (uVar4 / (uint)(iVar5 << 3));
        uVar7 = pjVar6[lVar12].h_samp_factor * x_crop_offset;
        JVar13 = 0;
        do {
          ppaJVar8 = (*srcinfo->mem->access_virt_barray)
                               ((j_common_ptr)srcinfo,src_coef_arrays[lVar12],JVar13,
                                pjVar6[lVar12].v_samp_factor,1);
          iVar9 = pjVar6[lVar12].v_samp_factor;
          if (0 < iVar9) {
            lVar18 = 0;
            do {
              if (uVar17 != 0) {
                paJVar15 = ppaJVar8[lVar18];
                lVar10 = 0;
                do {
                  pJVar11 = paJVar15[lVar10];
                  pJVar14 = paJVar15[~(uint)lVar10 + uVar17];
                  uVar16 = 0xfffffffe;
                  do {
                    JVar2 = *pJVar11;
                    *pJVar11 = *pJVar14;
                    *pJVar14 = JVar2;
                    sVar3 = pJVar11[1];
                    pJVar11[1] = -pJVar14[1];
                    pJVar14[1] = -sVar3;
                    uVar16 = uVar16 + 2;
                    pJVar11 = pJVar11 + 2;
                    pJVar14 = pJVar14 + 2;
                  } while (uVar16 < 0x3e);
                  lVar1 = lVar10 * 2;
                  lVar10 = lVar10 + 1;
                } while (lVar1 + 2U < (ulong)uVar17);
              }
              if ((uVar7 != 0) && (pjVar6[lVar12].width_in_blocks != 0)) {
                lVar10 = 0;
                uVar19 = 0;
                do {
                  paJVar15 = (JBLOCKROW)((long)*ppaJVar8[lVar18] + lVar10);
                  jcopy_block_row(paJVar15 + uVar7,paJVar15,1);
                  uVar19 = uVar19 + 1;
                  lVar10 = lVar10 + 0x80;
                } while (uVar19 < pjVar6[lVar12].width_in_blocks);
              }
              lVar18 = lVar18 + 1;
              iVar9 = pjVar6[lVar12].v_samp_factor;
            } while (lVar18 < iVar9);
          }
          JVar13 = JVar13 + iVar9;
        } while (JVar13 < pjVar6[lVar12].height_in_blocks);
      }
      lVar12 = lVar12 + 1;
    } while (lVar12 < dstinfo->num_components);
  }
  return;
}

Assistant:

LOCAL(void)
do_flip_h_no_crop(j_decompress_ptr srcinfo, j_compress_ptr dstinfo,
                  JDIMENSION x_crop_offset, jvirt_barray_ptr *src_coef_arrays)
/* Horizontal flip; done in-place, so no separate dest array is required.
 * NB: this only works when y_crop_offset is zero.
 */
{
  JDIMENSION MCU_cols, comp_width, blk_x, blk_y, x_crop_blocks;
  int ci, k, offset_y;
  JBLOCKARRAY buffer;
  JCOEFPTR ptr1, ptr2;
  JCOEF temp1, temp2;
  jpeg_component_info *compptr;

  /* Horizontal mirroring of DCT blocks is accomplished by swapping
   * pairs of blocks in-place.  Within a DCT block, we perform horizontal
   * mirroring by changing the signs of odd-numbered columns.
   * Partial iMCUs at the right edge are left untouched.
   */
  MCU_cols = srcinfo->output_width /
             (dstinfo->max_h_samp_factor * dstinfo_min_DCT_h_scaled_size);

  for (ci = 0; ci < dstinfo->num_components; ci++) {
    compptr = dstinfo->comp_info + ci;
    comp_width = MCU_cols * compptr->h_samp_factor;
    x_crop_blocks = x_crop_offset * compptr->h_samp_factor;
    for (blk_y = 0; blk_y < compptr->height_in_blocks;
         blk_y += compptr->v_samp_factor) {
      buffer = (*srcinfo->mem->access_virt_barray)
        ((j_common_ptr)srcinfo, src_coef_arrays[ci], blk_y,
         (JDIMENSION)compptr->v_samp_factor, TRUE);
      for (offset_y = 0; offset_y < compptr->v_samp_factor; offset_y++) {
        /* Do the mirroring */
        for (blk_x = 0; blk_x * 2 < comp_width; blk_x++) {
          ptr1 = buffer[offset_y][blk_x];
          ptr2 = buffer[offset_y][comp_width - blk_x - 1];
          /* this unrolled loop doesn't need to know which row it's on... */
          for (k = 0; k < DCTSIZE2; k += 2) {
            temp1 = *ptr1;      /* swap even column */
            temp2 = *ptr2;
            *ptr1++ = temp2;
            *ptr2++ = temp1;
            temp1 = *ptr1;      /* swap odd column with sign change */
            temp2 = *ptr2;
            *ptr1++ = -temp2;
            *ptr2++ = -temp1;
          }
        }
        if (x_crop_blocks > 0) {
          /* Now left-justify the portion of the data to be kept.
           * We can't use a single jcopy_block_row() call because that routine
           * depends on memcpy(), whose behavior is unspecified for overlapping
           * source and destination areas.  Sigh.
           */
          for (blk_x = 0; blk_x < compptr->width_in_blocks; blk_x++) {
            jcopy_block_row(buffer[offset_y] + blk_x + x_crop_blocks,
                            buffer[offset_y] + blk_x, (JDIMENSION)1);
          }
        }
      }
    }
  }
}